

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
::find_position<int>
          (dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *this,int *key)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  pair<unsigned_long,_unsigned_long> pVar10;
  
  sVar4 = this->num_buckets;
  uVar7 = (ulong)*key;
  piVar1 = &(this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
            super_Hasher.num_hashes_;
  *piVar1 = *piVar1 + 1;
  uVar8 = 0xffffffffffffffff;
  lVar9 = 1;
  do {
    uVar7 = uVar7 & sVar4 - 1;
    iVar2 = (this->key_info).empty_key;
    iVar3 = this->table[uVar7].first;
    piVar1 = &(this->key_info).super_Hasher.num_compares_;
    *piVar1 = *piVar1 + 1;
    if (iVar2 == iVar3) {
      uVar6 = uVar7;
      if (uVar8 != 0xffffffffffffffff) {
        uVar6 = uVar8;
      }
      uVar7 = 0xffffffffffffffff;
LAB_009853e1:
      pVar10.second = uVar6;
      pVar10.first = uVar7;
      return pVar10;
    }
    bVar5 = test_deleted(this,uVar7);
    if (bVar5) {
      if (uVar8 == 0xffffffffffffffff) {
        uVar8 = uVar7;
      }
    }
    else {
      iVar2 = *key;
      iVar3 = this->table[uVar7].first;
      piVar1 = &(this->key_info).super_Hasher.num_compares_;
      *piVar1 = *piVar1 + 1;
      if (iVar2 == iVar3) {
        uVar6 = 0xffffffffffffffff;
        goto LAB_009853e1;
      }
    }
    uVar7 = uVar7 + lVar9;
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    while (1) {                             // probe until something happens
      if (test_empty(bucknum)) {            // bucket is empty
        if (insert_pos == ILLEGAL_BUCKET)   // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);

      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;

      } else if (equals(key, get_key(table[bucknum]))) {
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }